

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
               (string *s,char *fmt,unsigned_short *v,OctahedralVector *args,Vector3<float> *args_1,
               float *args_2,uint *args_3,float *args_4,uint *args_5,float *args_6,uint *args_7)

{
  long lVar1;
  char *fmt_00;
  ulong uVar2;
  uint *in_RCX;
  ushort *in_RDX;
  string *in_RDI;
  float *in_R8;
  Vector3<float> *in_R9;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  OctahedralVector *in_stack_00000008;
  unsigned_short *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  string *in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd50;
  char **in_stack_fffffffffffffd58;
  char **in_stack_fffffffffffffd60;
  unsigned_short *v_00;
  uint *in_stack_fffffffffffffd68;
  float *in_stack_fffffffffffffd70;
  uint *in_stack_fffffffffffffd78;
  float *in_stack_fffffffffffffd80;
  uint *in_stack_fffffffffffffd88;
  string local_270 [32];
  undefined8 local_250;
  string local_248 [32];
  char *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  LogLevel in_stack_fffffffffffffdf4;
  string local_a0 [16];
  uint *in_stack_ffffffffffffff70;
  float *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  OctahedralVector *in_stack_ffffffffffffff88;
  undefined5 in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffb0;
  
  copyToFormatString(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff98,0x2a);
  bVar3 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff98,0x73);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff98,100);
  uVar5 = lVar1 != -1;
  if ((bVar3 & 1) == 0) {
    if ((bool)uVar5) {
      v_00 = (unsigned_short *)&stack0xffffffffffffff98;
      fmt_00 = (char *)std::__cxx11::string::find((char)v_00,100);
      IntegerFormatTrait<unsigned_short>::fmt();
      std::__cxx11::string::replace((ulong)v_00,(ulong)fmt_00,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<unsigned_short_const&>(fmt_00,v_00);
      std::__cxx11::string::operator+=(in_RDI,local_a0);
      std::__cxx11::string::~string(local_a0);
    }
    else if ((bVar4 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                 in_stack_fffffffffffffdd8);
      }
      std::__cxx11::string::c_str();
      formatOne<unsigned_short_const&>
                ((char *)in_stack_fffffffffffffd68,(unsigned_short *)in_stack_fffffffffffffd60);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd70);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdd8);
      std::ostream::operator<<(&stack0xfffffffffffffde8,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_250 = std::__cxx11::string::c_str();
      formatOne<char_const*>((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::operator+=(in_RDI,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdd8);
    }
    stringPrintfRecursive<pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
              (in_stack_ffffffffffffff98,
               (char *)CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(uVar5,in_stack_ffffffffffffff90))),
               in_stack_ffffffffffffff88,
               (Vector3<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffffb0,
               (uint *)in_R9,in_R8,in_RCX);
  }
  else {
    stringPrintfRecursiveWithPrecision<unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               in_stack_00000008,in_R9,(float *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd88);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}